

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O0

void __thiscall ProjectWriter::writeDemands(ProjectWriter *this)

{
  double dVar1;
  Node *pNVar2;
  bool bVar3;
  int iVar4;
  _Setw _Var5;
  _Setprecision _Var6;
  vector<Node_*,_std::allocator<Node_*>_> *this_00;
  reference ppNVar7;
  ostream *poVar8;
  pointer pDVar9;
  double dVar10;
  _Self local_48;
  _Self local_40;
  iterator demand;
  Junction *junc;
  Node *node;
  iterator __end1;
  iterator __begin1;
  vector<Node_*,_std::allocator<Node_*>_> *__range1;
  ProjectWriter *this_local;
  
  std::operator<<((ostream *)&this->field_0x18,"\n[DEMANDS]\n");
  this_00 = &this->network->nodes;
  __end1 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(this_00);
  node = (Node *)std::vector<Node_*,_std::allocator<Node_*>_>::end(this_00);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                     *)&node), bVar3) {
    ppNVar7 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&__end1);
    pNVar2 = *ppNVar7;
    iVar4 = (*(pNVar2->super_Element)._vptr_Element[2])();
    if (iVar4 == 0) {
      demand._M_node = (_List_node_base *)pNVar2;
      std::ostream::operator<<(&this->field_0x18,std::left);
      local_40._M_node =
           (_List_node_base *)
           std::__cxx11::list<Demand,_std::allocator<Demand>_>::begin
                     ((list<Demand,_std::allocator<Demand>_> *)&demand._M_node[10]._M_prev);
      while( true ) {
        local_48._M_node =
             (_List_node_base *)
             std::__cxx11::list<Demand,_std::allocator<Demand>_>::end
                       ((list<Demand,_std::allocator<Demand>_> *)&demand._M_node[10]._M_prev);
        bVar3 = std::operator!=(&local_40,&local_48);
        if (!bVar3) break;
        _Var5 = std::setw(0x10);
        poVar8 = std::operator<<((ostream *)&this->field_0x18,_Var5);
        poVar8 = std::operator<<(poVar8,(string *)&(pNVar2->super_Element).name);
        std::operator<<(poVar8," ");
        _Var5 = std::setw(0xc);
        poVar8 = std::operator<<((ostream *)&this->field_0x18,_Var5);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::fixed);
        _Var6 = std::setprecision(4);
        std::operator<<(poVar8,_Var6);
        pDVar9 = std::_List_iterator<Demand>::operator->(&local_40);
        dVar1 = pDVar9->baseDemand;
        dVar10 = Network::ucf(this->network,FLOW);
        std::ostream::operator<<(&this->field_0x18,dVar1 * dVar10);
        pDVar9 = std::_List_iterator<Demand>::operator->(&local_40);
        if (pDVar9->timePattern != (Pattern *)0x0) {
          _Var5 = std::setw(0x10);
          poVar8 = std::operator<<((ostream *)&this->field_0x18,_Var5);
          pDVar9 = std::_List_iterator<Demand>::operator->(&local_40);
          std::operator<<(poVar8,(string *)&(pDVar9->timePattern->super_Element).name);
        }
        std::operator<<((ostream *)&this->field_0x18,"\n");
        std::_List_iterator<Demand>::operator++(&local_40);
      }
    }
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void ProjectWriter::writeDemands()
{
    fout << "\n[DEMANDS]\n";
    for (Node* node : network->nodes)
    {
        if ( node->type() == Node::JUNCTION )
    	{
    	    Junction* junc = static_cast<Junction*>(node);
    	    fout << left;
    	    auto demand = junc->demands.begin();
    	    while ( demand != junc->demands.end() )
    	    {
    	        fout << setw(16) << node->name << " ";
    	        fout << setw(12) << fixed << setprecision(4);
    	        fout << demand->baseDemand * network->ucf(Units::FLOW);
    	        if (demand->timePattern != 0)
    	        {
    	            fout << setw(16) << demand->timePattern->name;
    	        }
    	        fout << "\n";
    	        ++demand;
    	    }
    	}
    }
}